

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStructSet
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StructSet *curr)

{
  undefined8 *puVar1;
  long *plVar2;
  Literal *pLVar3;
  undefined1 local_108 [8];
  Flow ref;
  Flow value;
  value_type field;
  anon_union_16_5_9943fe1e_for_Literal_0 local_50;
  long local_38;
  shared_ptr<wasm::GCData> data;
  
  visit((Flow *)local_108,this,*(Expression **)(curr + 0x18));
  if (ref.breakTo.super_IString.str._M_len == 0) {
    visit((Flow *)&ref.breakTo.super_IString.str._M_str,this,*(Expression **)(curr + 0x20));
    if (value.breakTo.super_IString.str._M_len == 0) {
      Flow::getSingleValue((Flow *)local_108);
      ::wasm::Literal::getGCData();
      if (local_38 == 0) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      local_50.i64 = ::wasm::Type::getHeapType();
      plVar2 = (long *)::wasm::HeapType::getStruct();
      puVar1 = (undefined8 *)(*plVar2 + (ulong)*(uint *)(curr + 0x10) * 0x10);
      value.breakTo.super_IString.str._M_str = (char *)*puVar1;
      field.type.id = puVar1[1];
      pLVar3 = Flow::getSingleValue((Flow *)&ref.breakTo.super_IString.str._M_str);
      ::wasm::Literal::Literal((Literal *)&field.packedType,pLVar3);
      truncateForPacking((Literal *)&local_50.func,this,(Literal *)&field.packedType,
                         (Field *)&value.breakTo.super_IString.str._M_str);
      pLVar3 = (Literal *)
               (*(long *)(local_38 + 0x28) + -0x18 + (ulong)*(uint *)(curr + 0x10) * 0x18);
      if ((ulong)*(uint *)(curr + 0x10) == 0) {
        pLVar3 = (Literal *)(local_38 + 0x10);
      }
      ::wasm::Literal::operator=(pLVar3,(Literal *)&local_50.func);
      ::wasm::Literal::~Literal((Literal *)&local_50.func);
      ::wasm::Literal::~Literal((Literal *)&field.packedType);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.func.super_IString.str._M_str = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ref.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_108);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_108);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructSet(StructSet* curr) {
    NOTE_ENTER("StructSet");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    auto field = curr->ref->type.getHeapType().getStruct().fields[curr->index];
    data->values[curr->index] =
      truncateForPacking(value.getSingleValue(), field);
    return Flow();
  }